

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_aggsig_verify_callback(secp256k1_scalar *sc,secp256k1_ge *pt,size_t idx,void *data)

{
  int iVar1;
  secp256k1_scalar *in_RCX;
  secp256k1_scalar *in_RDX;
  secp256k1_verify_callback_data *cbdata;
  size_t in_stack_00000060;
  uchar *in_stack_00000068;
  secp256k1_scalar *in_stack_00000070;
  undefined4 local_4;
  
  iVar1 = secp256k1_compute_sighash(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  if (iVar1 != 0) {
    secp256k1_scalar_negate(in_RDX,in_RCX);
    secp256k1_pubkey_load((secp256k1_context *)idx,(secp256k1_ge *)data,(secp256k1_pubkey *)cbdata);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int secp256k1_aggsig_verify_callback(secp256k1_scalar *sc, secp256k1_ge *pt, size_t idx, void *data) {
    secp256k1_verify_callback_data *cbdata = (secp256k1_verify_callback_data*) data;

    if (secp256k1_compute_sighash(sc, cbdata->prehash, idx) == 0) {
        return 0;
    }
    secp256k1_scalar_negate(sc, sc);
    secp256k1_pubkey_load(cbdata->ctx, pt, &cbdata->pubkeys[idx]);
    return 1;
}